

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int parse_config_file(char *fn)

{
  void *pvVar1;
  uint *in_RDI;
  char *data;
  char *in_stack_00000228;
  char *in_stack_00000230;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  pvVar1 = read_file((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (pvVar1 == (void *)0x0) {
    iVar2 = -1;
  }
  else {
    parse_config(in_stack_00000230,in_stack_00000228);
    DUMP();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int parse_config_file(const char *fn)
{
    char *data;
    data = read_file(fn, 0);
    if (!data) return -1;

    parse_config(fn, data);
    DUMP();
    return 0;
}